

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wsi.c
# Opt level: O0

int lws_wsi_mux_mark_parents_needing_writeable(lws *wsi)

{
  byte bVar1;
  lws *plVar2;
  lws *plStack_20;
  int already;
  lws *wsi2;
  lws *network_wsi;
  lws *wsi_local;
  
  plVar2 = lws_get_network_wsi(wsi);
  bVar1 = (plVar2->mux).requested_POLLOUT;
  for (plStack_20 = wsi; plStack_20 != (lws *)0x0; plStack_20 = (plStack_20->mux).parent_wsi) {
    (plStack_20->mux).requested_POLLOUT = '\x01';
    _lws_log(8,"%s: mark %p (sid %u) pending writable\n",
             "lws_wsi_mux_mark_parents_needing_writeable",plStack_20,(ulong)(plStack_20->mux).my_sid
            );
  }
  return (uint)bVar1;
}

Assistant:

int
lws_wsi_mux_mark_parents_needing_writeable(struct lws *wsi)
{
	struct lws *network_wsi = lws_get_network_wsi(wsi), *wsi2;
	int already = network_wsi->mux.requested_POLLOUT;

	/* mark everybody above him as requesting pollout */

	wsi2 = wsi;
	while (wsi2) {
		wsi2->mux.requested_POLLOUT = 1;
		lwsl_info("%s: mark %p (sid %u) pending writable\n", __func__,
				wsi2, wsi2->mux.my_sid);
		wsi2 = wsi2->mux.parent_wsi;
	}

	return already;
}